

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderArrow(ImDrawList *draw_list,ImVec2 pos,ImU32 col,ImGuiDir dir,float scale)

{
  char *text_begin;
  float fVar1;
  float fVar2;
  ImVec2 center;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_20 = pos;
  switch(dir) {
  case 0:
    text_begin = "<";
    break;
  case 1:
    text_begin = ">";
    break;
  case 2:
    text_begin = "^";
    break;
  case 3:
    text_begin = "v";
    break;
  default:
    fVar1 = pos.x + 0.0;
    fVar2 = pos.y + 0.0;
    local_8.y = fVar2;
    local_8.x = fVar1;
    local_10.y = fVar2;
    local_10.x = fVar1;
    local_18.y = fVar2;
    local_18.x = fVar1;
    ImDrawList::AddTriangleFilled(draw_list,&local_8,&local_10,&local_18,col);
    return;
  }
  ImDrawList::AddText(draw_list,(ImFont *)0x0,0.0,&local_20,col,text_begin,(char *)0x0,0.0,
                      (ImVec4 *)0x0);
  return;
}

Assistant:

void ImGui::RenderArrow(ImDrawList* draw_list, ImVec2 pos, ImU32 col, ImGuiDir dir, float scale)
{
    const float h = draw_list->_Data->FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = pos;

    ImVec2 a, b, c;
    switch (dir)
    {
    //case ImGuiDir_Up:
    //case ImGuiDir_Down:
    //    if (dir == ImGuiDir_Up) r = -r;
    //    a = ImVec2(+0.000f,+0.750f) * r;
    //    b = ImVec2(-0.866f,-0.750f) * r;
    //    c = ImVec2(+0.866f,-0.750f) * r;
    //    break;
    //case ImGuiDir_Left:
    //case ImGuiDir_Right:
    //    if (dir == ImGuiDir_Left) r = -r;
    //    a = ImVec2(+0.750f,+0.000f) * r;
    //    b = ImVec2(-0.750f,+0.866f) * r;
    //    c = ImVec2(-0.750f,-0.866f) * r;
    //    break;
    case ImGuiDir_Left:  draw_list->AddText(center, col, "<"); return;
    case ImGuiDir_Right: draw_list->AddText(center, col, ">"); return;
    case ImGuiDir_Up:    draw_list->AddText(center, col, "^"); return;
    case ImGuiDir_Down:  draw_list->AddText(center, col, "v"); return;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }
    draw_list->AddTriangleFilled(center + a, center + b, center + c, col);
}